

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

char * Qiniu_escape(char *s,escapeMode mode,Qiniu_Bool *fesc)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  Qiniu_Bool QVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  long lStack_60;
  
  sVar3 = strlen(s);
  iVar6 = 0;
  iVar7 = 0;
  for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
    bVar1 = s[sVar9];
    iVar2 = Qiniu_shouldEscape((uint)bVar1,mode);
    if (iVar2 != 0) {
      if (bVar1 == 0x20 && mode == encodeQueryComponent) {
        iVar7 = iVar7 + 1;
      }
      else {
        iVar6 = iVar6 + 1;
      }
    }
  }
  QVar5 = 0;
  if (iVar7 != 0 || iVar6 != 0) {
    pcVar4 = (char *)malloc(sVar3 + (long)(iVar6 * 2) + 1);
    lVar8 = 0;
    for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
      bVar1 = s[sVar9];
      iVar6 = Qiniu_shouldEscape((uint)bVar1,mode);
      if (iVar6 == 0) {
        pcVar4[lVar8] = bVar1;
LAB_0011d45b:
        lStack_60 = 1;
      }
      else {
        if (bVar1 == 0x20 && mode == encodeQueryComponent) {
          pcVar4[lVar8] = '+';
          goto LAB_0011d45b;
        }
        pcVar4[lVar8] = '%';
        pcVar4[lVar8 + 1] = "0123456789ABCDEF"[bVar1 >> 4];
        pcVar4[lVar8 + 2] = "0123456789ABCDEF"[bVar1 & 0xf];
        lStack_60 = 3;
      }
      lVar8 = lVar8 + lStack_60;
    }
    pcVar4[lVar8] = '\0';
    QVar5 = 1;
    s = pcVar4;
  }
  *fesc = QVar5;
  return s;
}

Assistant:

static char *Qiniu_escape(const char *s, escapeMode mode, Qiniu_Bool *fesc)
{
	int spaceCount = 0;
	int hexCount = 0;
	size_t i, j, len = strlen(s);
	int c;
	char *t;

	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				spaceCount++;
			}
			else
			{
				hexCount++;
			}
		}
	}

	if (spaceCount == 0 && hexCount == 0)
	{
		*fesc = Qiniu_False;
		return (char *)s;
	}

	t = (char *)malloc(len + 2 * hexCount + 1);
	j = 0;
	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				t[j] = '+';
				j++;
			}
			else
			{
				t[j] = '%';
				t[j + 1] = Qiniu_hexTable[c >> 4];
				t[j + 2] = Qiniu_hexTable[c & 15];
				j += 3;
			}
		}
		else
		{
			t[j] = s[i];
			j++;
		}
	}
	t[j] = '\0';
	*fesc = Qiniu_True;
	return t;
}